

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O3

void __thiscall DecHeap::trickle_down(DecHeap *this,size_t idx)

{
  pointer ppVar1;
  pointer puVar2;
  unsigned_long uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  pointer ppVar7;
  ulong uVar8;
  pointer ppVar10;
  unsigned_long __tmp;
  long lVar9;
  
  ppVar1 = (this->heap).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->heap).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4;
  uVar6 = idx * 2 + 1;
  if (uVar6 < uVar4) {
    lVar9 = idx * 2;
    puVar2 = (this->idx_map).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      uVar8 = lVar9 + 2;
      uVar5 = uVar6;
      if ((uVar8 < uVar4) && (uVar5 = uVar8, ppVar1[uVar6].first <= ppVar1[uVar8].first)) {
        uVar5 = uVar6;
      }
      uVar6 = ppVar1[idx].first;
      if (uVar6 <= ppVar1[uVar5].first) {
        return;
      }
      ppVar7 = ppVar1 + uVar5;
      ppVar10 = ppVar1 + idx;
      ppVar10->first = ppVar1[uVar5].first;
      ppVar7->first = uVar6;
      uVar3 = ppVar10->second;
      ppVar10->second = ppVar7->second;
      ppVar7->second = uVar3;
      puVar2[ppVar10->second] = idx;
      puVar2[ppVar7->second] = uVar5;
      lVar9 = uVar5 * 2;
      uVar6 = uVar5 * 2 + 1;
      idx = uVar5;
    } while (uVar6 < uVar4);
  }
  return;
}

Assistant:

void DecHeap::trickle_down(size_t idx) {
    while ((idx * 2 + 1) < heap.size()) {
        auto min_idx = idx * 2 + 1;
        if ((idx * 2 + 2) < heap.size() && heap[idx * 2 + 2].first < heap[idx * 2 + 1].first) {
            min_idx += 1;
        }
        if (heap[min_idx].first < heap[idx].first) {
            this->swap(idx, min_idx);
            idx = min_idx;
        } else {
            break;
        }
    }
}